

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::ResourceListTestCase::queryResourceList
          (ResourceListTestCase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dst,GLuint program)

{
  code *pcVar1;
  undefined4 uVar2;
  GLint GVar3;
  GLuint GVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  int iVar5;
  deUint32 dVar6;
  RenderContext *pRVar7;
  undefined4 extraout_var;
  TestLog *pTVar8;
  MessageBuilder *pMVar9;
  reference pvVar10;
  ulong uVar11;
  allocator local_519;
  value_type local_518;
  int local_4f4;
  int local_4f0;
  GLint written;
  int resourceNdx;
  MessageBuilder local_368;
  char *local_1e8 [3];
  MessageBuilder local_1d0;
  undefined1 local_50 [8];
  vector<char,_std::allocator<char>_> buffer;
  int local_30;
  GLint maxNameLength;
  GLint numActiveResources;
  GLenum programInterface;
  Functions *gl;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  GLuint program_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *dst_local;
  ResourceListTestCase *this_local;
  
  gl._4_4_ = program;
  pvStack_18 = dst;
  dst_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this;
  pRVar7 = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar5 = (*pRVar7->_vptr_RenderContext[3])();
  _numActiveResources = CONCAT44(extraout_var,iVar5);
  maxNameLength = getProgramInterfaceGLEnum(this->m_programInterface);
  local_30 = 0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)local_50);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_1d0,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_1d0,(char (*) [10])0x2b85bd5);
  local_1e8[0] = glu::getProgramInterfaceName(maxNameLength);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,local_1e8);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [12])" interface:");
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d0);
  (**(code **)(_numActiveResources + 0x990))(gl._4_4_,maxNameLength,0x92f5,&local_30);
  (**(code **)(_numActiveResources + 0x990))
            (gl._4_4_,maxNameLength,0x92f6,
             &buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
  dVar6 = (**(code **)(_numActiveResources + 0x800))();
  glu::checkError(dVar6,"query interface",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0x3f2);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_368,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<(&local_368,(char (*) [24])"\tGL_ACTIVE_RESOURCES = ");
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,&local_30);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [2])0x2b8f97b);
  pMVar9 = tcu::MessageBuilder::operator<<(pMVar9,(char (*) [23])"\tGL_MAX_NAME_LENGTH = ");
  pMVar9 = tcu::MessageBuilder::operator<<
                     (pMVar9,(int *)&buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                     field_0x14);
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_368);
  pTVar8 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<
            ((MessageBuilder *)&resourceNdx,pTVar8,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar9 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)&resourceNdx,(char (*) [30])"Querying all active resources")
  ;
  tcu::MessageBuilder::operator<<(pMVar9,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&resourceNdx);
  written._3_1_ = 0;
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)local_50,
             (long)(buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1),
             (value_type *)((long)&written + 3));
  for (local_4f0 = 0; GVar4 = gl._4_4_, GVar3 = maxNameLength,
      uVar2 = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_,
      iVar5 = local_4f0, local_4f0 < local_30; local_4f0 = local_4f0 + 1) {
    local_4f4 = 0;
    pcVar1 = *(code **)(_numActiveResources + 0x9c0);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_50,0);
    (*pcVar1)(GVar4,GVar3,iVar5,uVar2,&local_4f4,pvVar10);
    dVar6 = (**(code **)(_numActiveResources + 0x800))();
    glu::checkError(dVar6,"query resource name",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                    ,0x402);
    this_00 = pvStack_18;
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_50,0);
    uVar11 = (ulong)local_4f4;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_518,pvVar10,uVar11,&local_519);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    std::allocator<char>::~allocator((allocator<char> *)&local_519);
  }
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)local_50)
  ;
  return;
}

Assistant:

void ResourceListTestCase::queryResourceList (std::vector<std::string>& dst, glw::GLuint program)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLenum		programInterface	= getProgramInterfaceGLEnum(m_programInterface);
	glw::GLint				numActiveResources	= 0;
	glw::GLint				maxNameLength		= 0;
	std::vector<char>		buffer;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying " << glu::getProgramInterfaceName(programInterface) << " interface:" << tcu::TestLog::EndMessage;

	gl.getProgramInterfaceiv(program, programInterface, GL_ACTIVE_RESOURCES, &numActiveResources);
	gl.getProgramInterfaceiv(program, programInterface, GL_MAX_NAME_LENGTH, &maxNameLength);
	GLU_EXPECT_NO_ERROR(gl.getError(), "query interface");

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "\tGL_ACTIVE_RESOURCES = " << numActiveResources << "\n"
						<< "\tGL_MAX_NAME_LENGTH = " << maxNameLength
						<< tcu::TestLog::EndMessage;

	m_testCtx.getLog() << tcu::TestLog::Message << "Querying all active resources" << tcu::TestLog::EndMessage;

	buffer.resize(maxNameLength+1, '\0');

	for (int resourceNdx = 0; resourceNdx < numActiveResources; ++resourceNdx)
	{
		glw::GLint written = 0;

		gl.getProgramResourceName(program, programInterface, resourceNdx, maxNameLength, &written, &buffer[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "query resource name");

		dst.push_back(std::string(&buffer[0], written));
	}
}